

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O3

bool __thiscall efsw::FileInfo::isReadable(FileInfo *this)

{
  if (isReadable()::isRoot == '\0') {
    isReadable();
  }
  return (bool)((byte)(this->Permissions >> 8) & 1 | isReadable::isRoot);
}

Assistant:

bool FileInfo::isReadable() const {
#if EFSW_PLATFORM != EFSW_PLATFORM_WIN32
	static bool isRoot = getuid() == 0;
	return isRoot || 0 != S_ISRDBL( Permissions );
#else
	return 0 != S_ISRDBL( Permissions );
#endif
}